

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall ieee754::round_up(ieee754 *this)

{
  byte bVar1;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  if (this->ebits < 8) {
    uVar3 = this->bytes - 1;
  }
  else {
    uVar3 = 0;
    if (this->ebits < 0x10) {
      uVar3 = this->bytes - 2;
    }
  }
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      puVar2 = this->buf;
      if (puVar2[uVar4] != 0xff) {
        puVar2[uVar4] = puVar2[uVar4] + '\x01';
        return 0;
      }
      puVar2[uVar4] = '\0';
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  uVar6 = this->ebits;
  if ((int)uVar6 < 8) {
    uVar5 = 0x7f;
  }
  else {
    if (0xf < (int)uVar6) {
      uVar5 = 0;
      goto LAB_00239bca;
    }
    uVar6 = (uint)(byte)((char)uVar6 - 7);
    uVar5 = 0xff;
  }
  uVar5 = uVar5 >> ((byte)uVar6 & 0x1f);
LAB_00239bca:
  bVar1 = this->buf[(int)uVar3];
  uVar6 = bVar1 + 1 & uVar5 & 0xff;
  this->buf[(int)uVar3] = ~(byte)uVar5 & bVar1;
  this->buf[(int)uVar3] = this->buf[(int)uVar3] | (byte)uVar6;
  return (int)(uVar6 == 0);
}

Assistant:

int mantissa_msb_index() const
    {
        if (ebits <= 7)
            return bytes - 1;
        else if (ebits <= 15)
            return bytes - 2;
        else
        {
            assert(FALSE);
            return 0;
        }
    }